

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore.cpp
# Opt level: O1

QString * __thiscall QSystemSemaphore::key(QString *__return_storage_ptr__,QSystemSemaphore *this)

{
  long *plVar1;
  Data *pDVar2;
  
  plVar1 = *(long **)&((this->d)._M_t.
                       super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
                       .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl)->
                      nativeKey;
  if (plVar1 == (long *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pDVar2 = (Data *)*plVar1;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (char16_t *)plVar1[1];
    (__return_storage_ptr__->d).size = plVar1[2];
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      return __return_storage_ptr__;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QSystemSemaphore::key() const
{
    return QNativeIpcKeyPrivate::legacyKey(d->nativeKey);
}